

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

void __thiscall cplus::utils::List<int>::~List(List<int> *this)

{
  List<int> *this_local;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_toString_001490f0;
  reset(this);
  while (this->state != this->listEnd) {
    next(this);
    if (this->preview != (ListPoint *)0x0) {
      operator_delete(this->preview);
    }
  }
  if ((this->state != (ListPoint *)0x0) && (this->state != (ListPoint *)0x0)) {
    operator_delete(this->state);
  }
  if ((this->array != (int *)0x0) && (this->array != (int *)0x0)) {
    operator_delete__(this->array);
  }
  return;
}

Assistant:

~List() {
				reset(); //指针复位
				while (state != listEnd) {
					next(); //next只调用state的函数，对于上一个元素只需要地址即可
					delete preview; //删除上一个元素
				}
				if (state != nullptr)delete state; //遍历所有元素
				if (array != nullptr) delete[] array;
			}